

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_timer.c
# Opt level: O1

void test_create_timer(void)

{
  cio_error cVar1;
  cio_timer timer;
  cio_timer local_40;
  
  timerfd_create_fake.return_val = 1;
  cVar1 = cio_timer_init(&local_40,(cio_eventloop *)0x0,(cio_timer_close_hook_t)0x0);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x9c,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)cio_linux_eventloop_add_fake.call_count,(char *)0x0,0x9d,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)cio_linux_eventloop_register_read_fake.call_count,(char *)0x0,0x9e,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber(0,(ulong)close_fake.call_count,(char *)0x0,0x9f,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(ulong)cio_linux_eventloop_remove_fake.call_count,(char *)0x0,0xa0,
             UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_create_timer(void)
{
	timerfd_create_fake.return_val = 1;

	struct cio_timer timer;
	enum cio_error err = cio_timer_init(&timer, NULL, NULL);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);
	TEST_ASSERT_EQUAL(1, cio_linux_eventloop_add_fake.call_count);
	TEST_ASSERT_EQUAL(1, cio_linux_eventloop_register_read_fake.call_count);
	TEST_ASSERT_EQUAL(0, close_fake.call_count);
	TEST_ASSERT_EQUAL(0, cio_linux_eventloop_remove_fake.call_count);
}